

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

uint32_t __thiscall
VmaBlockMetadata_TLSF::GetListIndex
          (VmaBlockMetadata_TLSF *this,uint8_t memoryClass,uint16_t secondIndex)

{
  uint32_t uVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,memoryClass) != 0) {
    uVar1 = ((uint)memoryClass * 0x20 + (uint)secondIndex) - 0x1c;
    if ((this->super_VmaBlockMetadata).m_IsVirtual != false) {
      uVar1 = (uint)memoryClass * 0x20 + (uint)secondIndex;
    }
    return uVar1;
  }
  return (uint)secondIndex;
}

Assistant:

uint32_t VmaBlockMetadata_TLSF::GetListIndex(uint8_t memoryClass, uint16_t secondIndex) const
{
    if (memoryClass == 0)
        return secondIndex;

    const uint32_t index = static_cast<uint32_t>(memoryClass - 1) * (1 << SECOND_LEVEL_INDEX) + secondIndex;
    if (IsVirtual())
        return index + (1 << SECOND_LEVEL_INDEX);
    else
        return index + 4;
}